

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

char * inputline(void)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  ushort **ppuVar4;
  char *pcVar5;
  bool bVar6;
  int i;
  char *cp;
  char *in_stack_ffffffffffffffe8;
  ushort in_stack_fffffffffffffff0;
  undefined1 uVar7;
  char *in_stack_fffffffffffffff8;
  
  buf[0] = '\0';
  Gets(in_stack_fffffffffffffff8);
  sVar2 = strlen(buf);
  iVar1 = (int)sVar2;
  if (iVar1 != 0) {
    buf[iVar1 + -1] = '\0';
  }
  pcVar3 = index(buf,0x21);
  pcVar5 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    pcVar5 = pcVar3 + -1;
    *pcVar3 = '\0';
  }
  while( true ) {
    bVar6 = false;
    if ((char *)((long)&endblk + 7) < pcVar5) {
      ppuVar4 = __ctype_b_loc();
      bVar6 = ((*ppuVar4)[(int)*pcVar5] & 0x2000) != 0;
    }
    if (!bVar6) break;
    *pcVar5 = '\0';
    pcVar5 = pcVar5 + -1;
  }
  pcVar5 = buf;
  uVar7 = 0;
  while( true ) {
    bVar6 = false;
    if (*pcVar5 != '\0') {
      ppuVar4 = __ctype_b_loc();
      bVar6 = ((*ppuVar4)[(int)*pcVar5] & 0x2000) != 0;
    }
    if (!bVar6) break;
    pcVar5 = pcVar5 + 1;
  }
  pcVar5 = stralloc((char *)CONCAT44(iVar1,CONCAT13(uVar7,(uint3)in_stack_fffffffffffffff0)),
                    in_stack_ffffffffffffffe8);
  return pcVar5;
}

Assistant:

char *inputline()
{
	/* and removes comment, newline, beginning and trailing blanks */
	/* used to get the TITLE line */
	char            *cp;
	int             i;

	buf[0] = '\0';
	cp = Gets(buf);
	i = strlen(buf);
	if (i)
		buf[i - 1] = '\0';
	if ((cp = index(buf, '!')) != (char *) 0) {
		*cp-- = '\0';
	}
	while (cp >= buf && isspace(*cp)) {
		*cp-- = '\0';
	}
	/*EMPTY*/
	for (cp = buf; *cp != '\0' && isspace(*cp); cp++){
		;
	}
	return stralloc(cp, (char *) 0);
}